

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  semantic_tag param_1,ser_context *param_2,error_code *ec)

{
  int iVar1;
  bson_errc __e;
  pointer puVar2;
  pointer puVar3;
  value_type_conflict local_1d;
  bson_container_type local_1c;
  unsigned_long local_18;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  if (iVar1 < *(int *)((this->options_)._vptr_bson_encode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_bson_encode_options)) {
    puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = puVar2;
    if (puVar2 != (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      if ((this->stack_).
          super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->stack_).
          super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __e = expected_bson_document;
        goto LAB_001b6225;
      }
      before_value(this,'\x03');
      puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    local_18 = (long)puVar2 - (long)puVar3;
    local_1c = document;
    std::
    vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::bson::bson_container_type,unsigned_long>
              ((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
                *)&this->stack_,&local_1c,&local_18);
    local_1d = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              (&this->buffer_,
               (const_iterator)
               (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,4,&local_1d);
  }
  else {
    __e = max_nesting_depth_exceeded;
LAB_001b6225:
    std::error_code::operator=(ec,__e);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        if (buffer_.size() > 0)
        {
            if (stack_.empty())
            {
                ec = bson_errc::expected_bson_document;
                JSONCONS_VISITOR_RETURN;
            }
            before_value(jsoncons::bson::bson_type::document_type);
        }

        stack_.emplace_back(jsoncons::bson::bson_container_type::document, buffer_.size());
        buffer_.insert(buffer_.end(), sizeof(int32_t), 0);

        JSONCONS_VISITOR_RETURN;
    }